

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_validator.cpp
# Opt level: O1

void __thiscall duckdb::ThreadLines::Verify(ThreadLines *this)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  NotImplementedException *this_00;
  _Base_ptr p_Var4;
  _Rb_tree_header *p_Var5;
  bool bVar6;
  bool bVar7;
  ostringstream error;
  string local_1b8;
  ostringstream local_198 [376];
  
  p_Var3 = (this->thread_lines)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var5 = &(this->thread_lines)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var5) {
    bVar7 = false;
    p_Var4 = (_Base_ptr)0x0;
    do {
      bVar6 = true;
      if (bVar7) {
        p_Var1 = p_Var3[1]._M_parent;
        p_Var2 = p_Var3[1]._M_left;
        if (p_Var1 != p_Var3[1]._M_left) {
          if (((_Base_ptr)((long)&p_Var4->_M_color + 2U) < p_Var1) ||
             (bVar6 = bVar7, p_Var1 < (_Base_ptr)((long)&p_Var4[-1]._M_right + 6))) {
            ::std::__cxx11::ostringstream::ostringstream(local_198);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_198,
                       "The Parallel CSV Reader currently does not support a full read on this file."
                       ,0x4c);
            local_1b8._M_dataplus._M_p._0_1_ = 10;
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_198,(char *)&local_1b8,1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_198,
                       "To correctly parse this file, please run with the single threaded error (i.e., parallel = false)"
                       ,0x60);
            local_1b8._M_dataplus._M_p._0_1_ = 10;
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_198,(char *)&local_1b8,1);
            this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::stringbuf::str();
            NotImplementedException::NotImplementedException(this_00,&local_1b8);
            __cxa_throw(this_00,&NotImplementedException::typeinfo,
                        ::std::runtime_error::~runtime_error);
          }
          goto LAB_0155189b;
        }
      }
      else {
LAB_0155189b:
        p_Var2 = p_Var3[1]._M_left;
        bVar7 = bVar6;
      }
      p_Var4 = p_Var2;
      p_Var3 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var5);
  }
  return;
}

Assistant:

void ThreadLines::Verify() const {
	bool initialized = false;
	idx_t last_end_pos = 0;
	for (auto &line_info : thread_lines) {
		if (!initialized) {
			// First run, we just set the initialized to true
			initialized = true;
		} else {
			if (line_info.second.start_pos == line_info.second.end_pos) {
				last_end_pos = line_info.second.end_pos;
				continue;
			}
			if (last_end_pos + error_margin < line_info.second.start_pos ||
			    line_info.second.start_pos < last_end_pos - error_margin) {
				std::ostringstream error;
				error << "The Parallel CSV Reader currently does not support a full read on this file." << '\n';
				error << "To correctly parse this file, please run with the single threaded error (i.e., parallel = "
				         "false)"
				      << '\n';
				throw NotImplementedException(error.str());
			}
		}
		last_end_pos = line_info.second.end_pos;
	}
}